

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_long,_64UL>::small_vector
          (small_vector<unsigned_long,_64UL> *this,size_t required_elements)

{
  bool bVar1;
  size_t required_elements_local;
  small_vector<unsigned_long,_64UL> *this_local;
  
  this->elements_ = required_elements;
  memset(&this->small_buffer_,0,0x200);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->big_buffer_);
  this->buffer_ = (unsigned_long *)0x0;
  bVar1 = is_small(this->elements_);
  if (!bVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->big_buffer_,this->elements_);
  }
  set_buffer_ptr(this,this->elements_);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::size_t const required_elements)
            : elements_{required_elements} {

        if (!is_small (elements_)) {
            big_buffer_.resize (elements_);
        }
        this->set_buffer_ptr (elements_);
    }